

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssim.c
# Opt level: O1

double aom_highbd_ssim2(uint8_t *img1,uint8_t *img2,int stride_img1,int stride_img2,int width,
                       int height,uint32_t bd,uint32_t shift)

{
  ulong uVar1;
  ulong uVar2;
  short sVar3;
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  byte bVar8;
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  unkbyte10 Var16;
  int iVar17;
  long lVar18;
  byte bVar19;
  long lVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  int i;
  int iVar24;
  long lVar25;
  long lVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  ushort uVar33;
  undefined1 auVar32 [16];
  short sVar34;
  short sVar36;
  short sVar37;
  short sVar38;
  undefined1 auVar35 [16];
  undefined1 auVar39 [16];
  uint uVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  uint uVar44;
  int iVar46;
  double dVar45;
  int iVar47;
  int iVar48;
  int iVar50;
  double dVar49;
  int iVar51;
  int iVar52;
  uint uVar53;
  int iVar55;
  double dVar54;
  int iVar56;
  int iVar57;
  int iVar59;
  double dVar58;
  int iVar60;
  int iVar61;
  short sVar62;
  short sVar66;
  short sVar67;
  ushort uVar68;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  
  if (height < 8) {
    return NAN;
  }
  bVar8 = (byte)shift;
  bVar19 = bVar8 * '\x02';
  iVar17 = 0;
  dVar27 = 0.0;
  iVar22 = 0;
  do {
    if (7 < width) {
      lVar25 = 0;
      do {
        lVar20 = (long)(img1 + lVar25) * 2;
        lVar26 = (long)(img2 + lVar25) * 2;
        uVar23 = 0;
        uVar53 = 0;
        uVar21 = 0;
        uVar44 = 0;
        uVar40 = 0;
        iVar24 = 0;
        do {
          iVar59 = 0;
          iVar60 = 0;
          iVar61 = 0;
          iVar55 = 0;
          iVar56 = 0;
          iVar57 = 0;
          iVar50 = 0;
          iVar51 = 0;
          iVar52 = 0;
          iVar46 = 0;
          iVar47 = 0;
          iVar48 = 0;
          iVar41 = 0;
          iVar42 = 0;
          iVar43 = 0;
          lVar18 = 0;
          do {
            uVar1 = *(ulong *)(lVar20 + lVar18 * 2);
            auVar35._8_8_ = 0;
            auVar35._0_8_ = uVar1;
            uVar2 = *(ulong *)(lVar26 + lVar18 * 2);
            auVar63._8_8_ = 0;
            auVar63._0_8_ = uVar2;
            auVar30 = pmulhuw(auVar63,auVar35);
            sVar34 = (short)uVar1;
            sVar62 = (short)uVar2;
            sVar36 = (short)(uVar1 >> 0x10);
            sVar66 = (short)(uVar2 >> 0x10);
            sVar37 = (short)(uVar1 >> 0x20);
            sVar67 = (short)(uVar2 >> 0x20);
            sVar3 = (short)(uVar2 >> 0x30);
            sVar38 = (short)(uVar1 >> 0x30);
            uVar68 = sVar3 * sVar38;
            auVar65._0_12_ = ZEXT212(uVar68) << 0x30;
            auVar4._8_4_ = 0;
            auVar4._0_8_ = uVar1;
            auVar4._12_2_ = sVar38;
            auVar6._8_2_ = sVar37;
            auVar6._0_8_ = uVar1;
            auVar6._10_4_ = auVar4._10_4_;
            auVar11._6_8_ = 0;
            auVar11._0_6_ = auVar6._8_6_;
            auVar9._4_2_ = sVar36;
            auVar9._0_4_ = (uint)uVar1;
            auVar9._6_8_ = SUB148(auVar11 << 0x40,6);
            uVar23 = uVar23 + ((uint)uVar1 & 0xffff);
            iVar59 = iVar59 + auVar9._4_4_;
            iVar60 = iVar60 + auVar6._8_4_;
            iVar61 = iVar61 + (auVar4._10_4_ >> 0x10);
            auVar5._8_4_ = 0;
            auVar5._0_8_ = uVar2;
            auVar5._12_2_ = sVar3;
            auVar7._8_2_ = sVar67;
            auVar7._0_8_ = uVar2;
            auVar7._10_4_ = auVar5._10_4_;
            auVar12._6_8_ = 0;
            auVar12._0_6_ = auVar7._8_6_;
            auVar10._4_2_ = sVar66;
            auVar10._0_4_ = (uint)uVar2;
            auVar10._6_8_ = SUB148(auVar12 << 0x40,6);
            uVar53 = uVar53 + ((uint)uVar2 & 0xffff);
            iVar55 = iVar55 + auVar10._4_4_;
            iVar56 = iVar56 + auVar7._8_4_;
            iVar57 = iVar57 + (auVar5._10_4_ >> 0x10);
            auVar39 = pmulhuw(auVar35,auVar35);
            uVar33 = sVar38 * sVar38;
            auVar31._0_10_ = (unkuint10)uVar33 << 0x30;
            auVar32._0_12_ = ZEXT212(uVar33) << 0x30;
            auVar32._12_2_ = uVar33;
            auVar32._14_2_ = auVar39._6_2_;
            auVar31._12_4_ = auVar32._12_4_;
            auVar31._10_2_ = auVar39._4_2_;
            Var16 = CONCAT64(auVar31._10_6_,CONCAT22(sVar37 * sVar37,uVar33));
            auVar13._4_8_ = (long)((unkuint10)Var16 >> 0x10);
            auVar13._2_2_ = auVar39._2_2_;
            auVar13._0_2_ = sVar36 * sVar36;
            uVar21 = uVar21 + CONCAT22(auVar39._0_2_,sVar34 * sVar34);
            iVar50 = iVar50 + auVar13._0_4_;
            iVar51 = iVar51 + (int)((unkuint10)Var16 >> 0x10);
            iVar52 = iVar52 + auVar31._12_4_;
            auVar31 = pmulhuw(auVar63,auVar63);
            uVar33 = sVar3 * sVar3;
            auVar39._0_10_ = (unkuint10)uVar33 << 0x30;
            auVar29._0_12_ = ZEXT212(uVar33) << 0x30;
            auVar29._12_2_ = uVar33;
            auVar29._14_2_ = auVar31._6_2_;
            auVar39._12_4_ = auVar29._12_4_;
            auVar39._10_2_ = auVar31._4_2_;
            Var16 = CONCAT64(auVar39._10_6_,CONCAT22(sVar67 * sVar67,uVar33));
            auVar14._4_8_ = (long)((unkuint10)Var16 >> 0x10);
            auVar14._2_2_ = auVar31._2_2_;
            auVar14._0_2_ = sVar66 * sVar66;
            uVar44 = uVar44 + CONCAT22(auVar31._0_2_,sVar62 * sVar62);
            iVar46 = iVar46 + auVar14._0_4_;
            iVar47 = iVar47 + (int)((unkuint10)Var16 >> 0x10);
            iVar48 = iVar48 + auVar39._12_4_;
            auVar65._12_2_ = uVar68;
            auVar65._14_2_ = auVar30._6_2_;
            auVar64._12_4_ = auVar65._12_4_;
            auVar64._0_10_ = (unkuint10)uVar68 << 0x30;
            auVar64._10_2_ = auVar30._4_2_;
            Var16 = CONCAT64(auVar64._10_6_,CONCAT22(sVar67 * sVar37,uVar68));
            auVar15._4_8_ = (long)((unkuint10)Var16 >> 0x10);
            auVar15._2_2_ = auVar30._2_2_;
            auVar15._0_2_ = sVar66 * sVar36;
            uVar40 = uVar40 + CONCAT22(auVar30._0_2_,sVar62 * sVar34);
            iVar41 = iVar41 + auVar15._0_4_;
            iVar42 = iVar42 + (int)((unkuint10)Var16 >> 0x10);
            iVar43 = iVar43 + auVar64._12_4_;
            lVar18 = lVar18 + 4;
          } while (lVar18 != 8);
          uVar23 = iVar61 + iVar59 + iVar60 + uVar23;
          uVar53 = iVar57 + iVar55 + iVar56 + uVar53;
          uVar21 = iVar52 + iVar50 + iVar51 + uVar21;
          uVar44 = iVar48 + iVar46 + iVar47 + uVar44;
          uVar40 = iVar43 + iVar41 + iVar42 + uVar40;
          iVar24 = iVar24 + 1;
          lVar20 = lVar20 + (long)stride_img1 * 2;
          lVar26 = lVar26 + (long)stride_img2 * 2;
        } while (iVar24 != 8);
        dVar49 = 26634.0;
        dVar45 = 239708.0;
        if (bd == 8) {
LAB_008b7d41:
          dVar58 = (double)(uVar23 >> (bVar8 & 0x1f));
          dVar54 = (double)(uVar53 >> (bVar8 & 0x1f));
          dVar28 = (dVar58 + dVar58) * dVar54;
          dVar45 = ((((double)(uVar40 >> (bVar19 & 0x1f)) * 128.0 - dVar28) + dVar45) *
                   (dVar28 + dVar49)) /
                   (((((double)(uVar44 >> (bVar19 & 0x1f)) * 64.0 +
                      ((double)(uVar21 >> (bVar19 & 0x1f)) * 64.0 - dVar58 * dVar58)) -
                     dVar54 * dVar54) + dVar45) * (dVar58 * dVar58 + dVar54 * dVar54 + dVar49));
        }
        else {
          if (bd == 0xc) {
            dVar49 = 6868593.0;
            dVar45 = 61817334.0;
            goto LAB_008b7d41;
          }
          dVar45 = 0.0;
          if (bd == 10) {
            dVar49 = 428658.0;
            dVar45 = 3857925.0;
            goto LAB_008b7d41;
          }
        }
        dVar27 = dVar27 + dVar45;
        lVar25 = lVar25 + 4;
      } while (lVar25 <= (int)(width - 8U));
      iVar17 = iVar17 + (width - 8U >> 2) + 1;
    }
    iVar22 = iVar22 + 4;
    img1 = img1 + stride_img1 * 4;
    img2 = img2 + stride_img2 * 4;
    if (height + -8 < iVar22) {
      return dVar27 / (double)iVar17;
    }
  } while( true );
}

Assistant:

double aom_highbd_ssim2(const uint8_t *img1, const uint8_t *img2,
                        int stride_img1, int stride_img2, int width, int height,
                        uint32_t bd, uint32_t shift) {
  int i, j;
  int samples = 0;
  double ssim_total = 0;

  // sample point start with each 4x4 location
  for (i = 0; i <= height - 8;
       i += 4, img1 += stride_img1 * 4, img2 += stride_img2 * 4) {
    for (j = 0; j <= width - 8; j += 4) {
      double v = highbd_ssim_8x8(CONVERT_TO_SHORTPTR(img1 + j), stride_img1,
                                 CONVERT_TO_SHORTPTR(img2 + j), stride_img2, bd,
                                 shift);
      ssim_total += v;
      samples++;
    }
  }
  ssim_total /= samples;
  return ssim_total;
}